

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_set_f32_nd(ggml_tensor *tensor,int i0,int i1,int i2,int i3,float value)

{
  ggml_bf16_t gVar1;
  float *pfVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  undefined1 auVar3 [16];
  void *data;
  
  pfVar2 = (float *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * *(long *)(in_RDI + 0xc) +
                     (long)in_EDX * *(long *)(in_RDI + 0xe) +
                     (long)in_ECX * *(long *)(in_RDI + 0x10) +
                    (long)in_R8D * *(long *)(in_RDI + 0x12));
  switch(*in_RDI) {
  case 0:
    *pfVar2 = in_XMM0_Da;
    break;
  case 1:
    auVar3 = vcvtps2ph_f16c(ZEXT416((uint)in_XMM0_Da),0);
    *(uint16_t *)pfVar2 = auVar3._0_2_;
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x48f,"fatal error");
    break;
  case 0x18:
    *(char *)pfVar2 = (char)(int)in_XMM0_Da;
    break;
  case 0x19:
    *(uint16_t *)pfVar2 = (uint16_t)(int)in_XMM0_Da;
    break;
  case 0x1a:
    *pfVar2 = (float)(int)in_XMM0_Da;
    break;
  case 0x1e:
    gVar1 = ggml_compute_fp32_to_bf16(in_XMM0_Da);
    *(uint16_t *)pfVar2 = gVar1.bits;
  }
  return;
}

Assistant:

void ggml_set_f32_nd(const struct ggml_tensor * tensor, int i0, int i1, int i2, int i3, float value) {
    void * data   = (char *) tensor->data + i0*tensor->nb[0] + i1*tensor->nb[1] + i2*tensor->nb[2] + i3*tensor->nb[3];
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                ((int8_t *)(data))[0] = value;
            } break;
        case GGML_TYPE_I16:
            {
                ((int16_t *)(data))[0] = value;
            } break;
        case GGML_TYPE_I32:
            {
                ((int32_t *)(data))[0] = value;
            } break;
        case GGML_TYPE_F16:
            {
                ((ggml_fp16_t *)(data))[0] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                ((ggml_bf16_t *)(data))[0] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                ((float *)(data))[0] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}